

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# setup_common.cpp
# Opt level: O3

CBlock * __thiscall
TestChain100Setup::CreateBlock
          (CBlock *__return_storage_ptr__,TestChain100Setup *this,
          vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *txns,
          CScript *scriptPubKey,Chainstate *chainstate)

{
  uint32_t *puVar1;
  pointer pCVar2;
  uint256 hash;
  uchar uVar3;
  uchar uVar4;
  uchar uVar5;
  uchar uVar6;
  undefined1 auVar7 [8];
  bool bVar8;
  unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *puVar9;
  long lVar10;
  _Head_base<0UL,_node::CBlockTemplate_*,_false> _Var11;
  CBlock *pCVar12;
  pointer __args;
  unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *val;
  long in_FS_OFFSET;
  byte bVar13;
  Options options;
  undefined1 local_158 [8];
  BlockAssembler local_150;
  Options local_88;
  uint256 local_58;
  long local_38;
  
  bVar13 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_88.super_BlockCreateOptions.use_mempool = true;
  local_88.super_BlockCreateOptions.coinbase_max_additional_weight = 4000;
  local_88.super_BlockCreateOptions.coinbase_output_max_additional_sigops = 400;
  local_88.nBlockMaxWeight = 0x3cf960;
  local_88.blockMinFeeRate.nSatoshisPerK = 1000;
  local_88.test_block_validity = true;
  local_88.print_modified_fee = false;
  ::node::BlockAssembler::BlockAssembler(&local_150,chainstate,(CTxMemPool *)0x0,&local_88);
  ::node::BlockAssembler::CreateNewBlock((BlockAssembler *)local_158,(CScript *)&local_150);
  auVar7 = local_158;
  _Var11._M_head_impl = (CBlockTemplate *)local_158;
  pCVar12 = __return_storage_ptr__;
  for (lVar10 = 10; lVar10 != 0; lVar10 = lVar10 + -1) {
    uVar3 = ((_Var11._M_head_impl)->block).super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.
            m_data._M_elems[0];
    uVar4 = ((_Var11._M_head_impl)->block).super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.
            m_data._M_elems[1];
    uVar5 = ((_Var11._M_head_impl)->block).super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.
            m_data._M_elems[2];
    uVar6 = ((_Var11._M_head_impl)->block).super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.
            m_data._M_elems[3];
    (pCVar12->super_CBlockHeader).nVersion =
         ((_Var11._M_head_impl)->block).super_CBlockHeader.nVersion;
    (pCVar12->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0] = uVar3;
    (pCVar12->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[1] = uVar4;
    (pCVar12->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[2] = uVar5;
    (pCVar12->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[3] = uVar6;
    _Var11._M_head_impl = (CBlockTemplate *)((long)_Var11._M_head_impl + (ulong)bVar13 * -0x10 + 8);
    pCVar12 = (CBlock *)((long)pCVar12 + (ulong)bVar13 * -0x10 + 8);
  }
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector(&__return_storage_ptr__->vtx,
           (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)((long)local_158 + 0x50));
  __return_storage_ptr__->m_checked_merkle_root = *(bool *)((long)auVar7 + 0x6a);
  *(undefined2 *)&__return_storage_ptr__->fChecked = *(undefined2 *)((long)auVar7 + 0x68);
  if ((_Head_base<0UL,_node::CBlockTemplate_*,_false>)local_158 !=
      (_Head_base<0UL,_node::CBlockTemplate_*,_false>)0x0) {
    std::default_delete<node::CBlockTemplate>::operator()
              ((default_delete<node::CBlockTemplate> *)local_158,(CBlockTemplate *)local_158);
  }
  local_158 = (undefined1  [8])0x0;
  std::
  _Hashtable<transaction_identifier<false>,_transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>,_std::__detail::_Identity,_std::equal_to<transaction_identifier<false>_>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_150.inBlock._M_h);
  if (local_150.pblocktemplate._M_t.
      super___uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>._M_t.
      super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>.
      super__Head_base<0UL,_node::CBlockTemplate_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>)0x0) {
    std::default_delete<node::CBlockTemplate>::operator()
              ((default_delete<node::CBlockTemplate> *)&local_150,
               (CBlockTemplate *)
               local_150.pblocktemplate._M_t.
               super___uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>
               ._M_t.
               super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>
               .super__Head_base<0UL,_node::CBlockTemplate_*,_false>._M_head_impl);
  }
  local_150.pblocktemplate._M_t.
  super___uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>._M_t.
  super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>.
  super__Head_base<0UL,_node::CBlockTemplate_*,_false>._M_head_impl._0_1_ =
       (long)(__return_storage_ptr__->vtx).
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(__return_storage_ptr__->vtx).
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_start == 0x10;
  inline_assertion_check<true,bool>
            ((bool *)&local_150,
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util/setup_common.cpp"
             ,0x18a,"CreateBlock","block.vtx.size() == 1");
  __args = (txns->super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pCVar2 = (txns->super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (__args != pCVar2) {
    do {
      local_150.pblocktemplate._M_t.
      super___uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>._M_t.
      super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>.
      super__Head_base<0UL,_node::CBlockTemplate_*,_false>._M_head_impl =
           (__uniq_ptr_data<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>,_true,_true>
            )(__uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction_const&>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_150.nBlockWeight,
                 (CTransaction **)&local_150,(allocator<CTransaction> *)local_158,__args);
      std::
      vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>
      ::emplace_back<std::shared_ptr<CTransaction_const>>
                ((vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>
                  *)&__return_storage_ptr__->vtx,(shared_ptr<const_CTransaction> *)&local_150);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150.nBlockWeight !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150.nBlockWeight);
      }
      __args = __args + 1;
    } while (__args != pCVar2);
  }
  val = &(this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.m_node.chainman;
  puVar9 = inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
                     (val,
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util/setup_common.cpp"
                      ,0x18e,"CreateBlock","m_node.chainman");
  ::node::RegenerateCommitments
            (__return_storage_ptr__,
             (puVar9->_M_t).
             super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>._M_t.
             super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
             super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  while( true ) {
    CBlockHeader::GetHash(&local_58,&__return_storage_ptr__->super_CBlockHeader);
    hash.super_base_blob<256U>.m_data._M_elems[8] =
         local_58.super_base_blob<256U>.m_data._M_elems[8];
    hash.super_base_blob<256U>.m_data._M_elems[9] =
         local_58.super_base_blob<256U>.m_data._M_elems[9];
    hash.super_base_blob<256U>.m_data._M_elems[10] =
         local_58.super_base_blob<256U>.m_data._M_elems[10];
    hash.super_base_blob<256U>.m_data._M_elems[0xb] =
         local_58.super_base_blob<256U>.m_data._M_elems[0xb];
    hash.super_base_blob<256U>.m_data._M_elems[0xc] =
         local_58.super_base_blob<256U>.m_data._M_elems[0xc];
    hash.super_base_blob<256U>.m_data._M_elems[0xd] =
         local_58.super_base_blob<256U>.m_data._M_elems[0xd];
    hash.super_base_blob<256U>.m_data._M_elems[0xe] =
         local_58.super_base_blob<256U>.m_data._M_elems[0xe];
    hash.super_base_blob<256U>.m_data._M_elems[0xf] =
         local_58.super_base_blob<256U>.m_data._M_elems[0xf];
    hash.super_base_blob<256U>.m_data._M_elems[0] =
         local_58.super_base_blob<256U>.m_data._M_elems[0];
    hash.super_base_blob<256U>.m_data._M_elems[1] =
         local_58.super_base_blob<256U>.m_data._M_elems[1];
    hash.super_base_blob<256U>.m_data._M_elems[2] =
         local_58.super_base_blob<256U>.m_data._M_elems[2];
    hash.super_base_blob<256U>.m_data._M_elems[3] =
         local_58.super_base_blob<256U>.m_data._M_elems[3];
    hash.super_base_blob<256U>.m_data._M_elems[4] =
         local_58.super_base_blob<256U>.m_data._M_elems[4];
    hash.super_base_blob<256U>.m_data._M_elems[5] =
         local_58.super_base_blob<256U>.m_data._M_elems[5];
    hash.super_base_blob<256U>.m_data._M_elems[6] =
         local_58.super_base_blob<256U>.m_data._M_elems[6];
    hash.super_base_blob<256U>.m_data._M_elems[7] =
         local_58.super_base_blob<256U>.m_data._M_elems[7];
    hash.super_base_blob<256U>.m_data._M_elems[0x10] =
         local_58.super_base_blob<256U>.m_data._M_elems[0x10];
    hash.super_base_blob<256U>.m_data._M_elems[0x11] =
         local_58.super_base_blob<256U>.m_data._M_elems[0x11];
    hash.super_base_blob<256U>.m_data._M_elems[0x12] =
         local_58.super_base_blob<256U>.m_data._M_elems[0x12];
    hash.super_base_blob<256U>.m_data._M_elems[0x13] =
         local_58.super_base_blob<256U>.m_data._M_elems[0x13];
    hash.super_base_blob<256U>.m_data._M_elems[0x14] =
         local_58.super_base_blob<256U>.m_data._M_elems[0x14];
    hash.super_base_blob<256U>.m_data._M_elems[0x15] =
         local_58.super_base_blob<256U>.m_data._M_elems[0x15];
    hash.super_base_blob<256U>.m_data._M_elems[0x16] =
         local_58.super_base_blob<256U>.m_data._M_elems[0x16];
    hash.super_base_blob<256U>.m_data._M_elems[0x17] =
         local_58.super_base_blob<256U>.m_data._M_elems[0x17];
    hash.super_base_blob<256U>.m_data._M_elems[0x18] =
         local_58.super_base_blob<256U>.m_data._M_elems[0x18];
    hash.super_base_blob<256U>.m_data._M_elems[0x19] =
         local_58.super_base_blob<256U>.m_data._M_elems[0x19];
    hash.super_base_blob<256U>.m_data._M_elems[0x1a] =
         local_58.super_base_blob<256U>.m_data._M_elems[0x1a];
    hash.super_base_blob<256U>.m_data._M_elems[0x1b] =
         local_58.super_base_blob<256U>.m_data._M_elems[0x1b];
    hash.super_base_blob<256U>.m_data._M_elems[0x1c] =
         local_58.super_base_blob<256U>.m_data._M_elems[0x1c];
    hash.super_base_blob<256U>.m_data._M_elems[0x1d] =
         local_58.super_base_blob<256U>.m_data._M_elems[0x1d];
    hash.super_base_blob<256U>.m_data._M_elems[0x1e] =
         local_58.super_base_blob<256U>.m_data._M_elems[0x1e];
    hash.super_base_blob<256U>.m_data._M_elems[0x1f] =
         local_58.super_base_blob<256U>.m_data._M_elems[0x1f];
    bVar8 = CheckProofOfWork(hash,(__return_storage_ptr__->super_CBlockHeader).nBits,
                             &((((val->_M_t).
                                 super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                                 .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl)->
                               m_options).chainparams)->consensus);
    if (bVar8) break;
    puVar1 = &(__return_storage_ptr__->super_CBlockHeader).nNonce;
    *puVar1 = *puVar1 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

CBlock TestChain100Setup::CreateBlock(
    const std::vector<CMutableTransaction>& txns,
    const CScript& scriptPubKey,
    Chainstate& chainstate)
{
    BlockAssembler::Options options;
    CBlock block = BlockAssembler{chainstate, nullptr, options}.CreateNewBlock(scriptPubKey)->block;

    Assert(block.vtx.size() == 1);
    for (const CMutableTransaction& tx : txns) {
        block.vtx.push_back(MakeTransactionRef(tx));
    }
    RegenerateCommitments(block, *Assert(m_node.chainman));

    while (!CheckProofOfWork(block.GetHash(), block.nBits, m_node.chainman->GetConsensus())) ++block.nNonce;

    return block;
}